

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O0

void RigidBodyDynamics::ForwardDynamicsContactsDirect
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau,ConstraintSet *CS,
               VectorNd *QDDot)

{
  Scalar *pSVar1;
  ulong uVar2;
  size_t sVar3;
  long in_RDI;
  long in_R8;
  long index;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *this;
  uint i_1;
  uint i;
  ConstraintSet *in_stack_00000070;
  VectorNd *in_stack_00000078;
  VectorNd *in_stack_00000080;
  VectorNd *in_stack_00000088;
  Model *in_stack_00000090;
  VectorNd *in_stack_000002a8;
  VectorNd *in_stack_000002b0;
  VectorNd *in_stack_000002b8;
  VectorNd *in_stack_000002c0;
  MatrixNd *in_stack_000002c8;
  MatrixNd *in_stack_000002d0;
  MatrixNd *in_stack_000002e0;
  VectorNd *in_stack_000002e8;
  VectorNd *in_stack_000002f0;
  LinearSolver *in_stack_000002f8;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_ffffffffffffff28;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_ffffffffffffff30;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff50;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff58;
  Scalar SVar4;
  undefined4 local_7c;
  undefined4 local_78;
  
  CalcContactSystemVariables
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
             in_stack_00000070);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  index = in_R8 + 0xf8;
  this = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)(in_R8 + 0x110);
  SolveContactSystemDirect
            (in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
             in_stack_000002b0,in_stack_000002a8,in_stack_000002e0,in_stack_000002e8,
             in_stack_000002f0,in_stack_000002f8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x14e264);
  for (local_78 = 0; local_78 < *(uint *)(in_RDI + 0x48); local_78 = local_78 + 1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    SVar4 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    *pSVar1 = SVar4;
  }
  local_7c = 0;
  while( true ) {
    uVar2 = (ulong)local_7c;
    sVar3 = ConstraintSet::size((ConstraintSet *)0x14e309);
    if (sVar3 <= uVar2) break;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    SVar4 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (this,index);
    *pSVar1 = -SVar4;
    local_7c = local_7c + 1;
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsContactsDirect (
		Model &model,
		const VectorNd &Q,
		const VectorNd &QDot,
		const VectorNd &Tau,
		ConstraintSet &CS,
		VectorNd &QDDot
		) {
	LOG << "-------- " << __func__ << " --------" << std::endl;

	CalcContactSystemVariables (model, Q, QDot, Tau, CS);

	SolveContactSystemDirect (CS.H, CS.G, Tau - CS.C, CS.gamma, QDDot, CS.force, CS.A, CS.b, CS.x, CS.linear_solver);

	// Copy back QDDot
	for (unsigned int i = 0; i < model.dof_count; i++)
		QDDot[i] = CS.x[i];

	// Copy back contact forces
	for (unsigned int i = 0; i < CS.size(); i++) {
		CS.force[i] = -CS.x[model.dof_count + i];
	}
}